

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

Status google::protobuf::json_internal::anon_unknown_5::
       ParseMap<google::protobuf::json_internal::ParseProto2Descriptor>
                 (JsonLexer *lex,Field<google::protobuf::json_internal::ParseProto2Descriptor> field
                 ,Msg<google::protobuf::json_internal::ParseProto2Descriptor> *msg)

{
  int *piVar1;
  byte bVar2;
  int iVar3;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
  aVar4;
  bool bVar5;
  char cVar6;
  bool bVar7;
  FieldDescriptor *pFVar8;
  string *psVar9;
  string *psVar10;
  Msg *in_RCX;
  Status *_status;
  char *in_R8;
  Metadata MVar11;
  string_view sVar12;
  string_view literal;
  string_view literal_00;
  string_view x;
  int64_t val;
  StatusOr<google::protobuf::json_internal::JsonLexer::Kind> kind;
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys_seen;
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
  insert_result;
  bool local_179;
  string_view *local_178;
  code *local_170;
  string_view local_168;
  Msg *local_158;
  string **local_150;
  char *local_148;
  Descriptor *local_140;
  string_view local_138;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
  local_128;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
  local_120;
  long local_118 [3];
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
  local_100;
  undefined8 local_f8;
  string_view local_d0;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
  local_c0;
  _Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
  local_b8;
  _Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
  local_88;
  undefined1 local_68 [32];
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
  local_48;
  
  local_158 = in_RCX;
  JsonLexer::PeekKind((JsonLexer *)&local_c0.status_);
  aVar4 = local_c0;
  absl::lts_20240722::internal_statusor::
  StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>::~StatusOrData
            ((StatusOrData<google::protobuf::json_internal::JsonLexer::Kind> *)&local_c0.status_);
  if ((aVar4 == (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                 )0x1) && (local_b8._0_4_ == 6)) {
    JsonLexer::Expect(lex,field,4,"null");
    return (Status)(uintptr_t)lex;
  }
  local_68._0_8_ = 0;
  local_68._8_8_ = (char *)0x0;
  local_68._16_8_ = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>;
  JsonLexer::Expect(lex,field,1,"{");
  if ((lex->stream_).stream_ == (ZeroCopyInputStream *)0x1) {
    iVar3 = *(int *)((long)&field->field_22 + 4);
    if (iVar3 == 0) {
      JsonLocation::Invalid
                ((JsonLocation *)lex,&field[1].all_names_,0x22,"JSON content was too deeply nested")
      ;
    }
    else {
      *(int *)((long)&field->field_22 + 4) = iVar3 + -1;
      (lex->stream_).stream_ = (ZeroCopyInputStream *)0x1;
    }
    if ((lex->stream_).stream_ == (ZeroCopyInputStream *)0x1) {
      sVar12._M_str = "}";
      sVar12._M_len = 1;
      bVar5 = JsonLexer::Peek((JsonLexer *)field,sVar12);
      if (bVar5) {
        piVar1 = (int *)((long)&field->field_22 + 4);
        *piVar1 = *piVar1 + 1;
      }
      else {
        local_150 = &field[1].all_names_;
        local_179 = true;
        local_148 = "expected \',\'";
        do {
          if (local_179 == false) goto LAB_002c8c99;
          JsonLexer::SkipToToken(lex);
          if ((lex->stream_).stream_ != (ZeroCopyInputStream *)0x1) goto LAB_002c8cb0;
          absl::lts_20240722::
          StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::StatusOr((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                      *)&local_c0.status_);
          cVar6 = ZeroCopyBufferedStream::PeekChar((ZeroCopyBufferedStream *)field);
          if ((cVar6 != '\"') &&
             (cVar6 = ZeroCopyBufferedStream::PeekChar((ZeroCopyBufferedStream *)field),
             cVar6 != '\'')) {
            if (field[1].super_SymbolBase.symbol_type_ == '\x01') {
              JsonLexer::ParseBareWord
                        ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                          *)&local_128.status_,(JsonLexer *)field);
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::operator=((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                           *)&local_c0.status_,
                          (StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                           *)&local_128.status_);
              goto LAB_002c86e7;
            }
            JsonLocation::Invalid((JsonLocation *)lex,local_150,0xc,"expected \'\"\'");
            goto LAB_002c8b8c;
          }
          JsonLexer::ParseUtf8
                    ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                      *)&local_128.status_,(JsonLexer *)field);
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::operator=((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                       *)&local_c0.status_,
                      (StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                       *)&local_128.status_);
LAB_002c86e7:
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                           *)&local_128.status_);
          (lex->stream_).stream_ = (ZeroCopyInputStream *)local_c0;
          if (((ulong)local_c0 & 1) == 0) {
            LOCK();
            *(int *)local_c0 = *(int *)local_c0 + 1;
            UNLOCK();
          }
          if (((lex->stream_).stream_ != (ZeroCopyInputStream *)0x1) ||
             (JsonLexer::Expect(lex,field,1,":"),
             (lex->stream_).stream_ != (ZeroCopyInputStream *)0x1)) goto LAB_002c8b8c;
          if (local_c0 !=
              (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
               )0x1) {
            psVar10 = (string *)
                      absl::lts_20240722::internal_statusor::Helper::Crash(&local_c0.status_);
LAB_002c8cdf:
            absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_128,
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                       ,0xab7,*(undefined8 *)(psVar10 + 8),*(undefined8 *)psVar10);
            absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_128.status_);
          }
          piVar1 = (int *)((long)&(field[1].scope_.containing_oneof)->all_names_[-1].field_2 + 8);
          *piVar1 = *piVar1 + 1;
          _local_128 = MaybeOwnedString::AsView((MaybeOwnedString *)&local_b8._M_first);
          local_178 = (string_view *)local_68;
          absl::lts_20240722::container_internal::
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::__cxx11::string>>
          ::EmplaceDecomposable::operator()
                    (&local_48,&local_178,
                     (basic_string_view<char,_std::char_traits<char>_> *)&local_128.status_,
                     (basic_string_view<char,_std::char_traits<char>_> *)&local_128);
          if (local_48.second == false) {
            local_138 = MaybeOwnedString::AsView((MaybeOwnedString *)&local_b8._M_first);
            local_178 = &local_138;
            local_170 = absl::lts_20240722::str_format_internal::FormatArgImpl::
                        Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
            in_R8 = (char *)0x1;
            absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
                      (&local_128,"got unexpectedly-repeated repeated map key: \'%s\'",0x30,
                       &local_178);
            JsonLocation::Invalid((JsonLocation *)lex,&local_88,local_120,local_128);
            if (local_128 !=
                (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                 )local_118) {
              operator_delete((void *)local_128,local_118[0] + 1);
            }
            goto LAB_002c8b69;
          }
          ParseProto2Descriptor::RecordAsSeen((Field)msg,local_158);
          bVar2 = *(byte *)((long)&msg->msg_ + 1);
          bVar5 = (bool)((bVar2 & 0x20) >> 5);
          if (0xbf < bVar2 == bVar5) {
            psVar10 = (string *)0x0;
          }
          else {
            psVar10 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                (bVar5,0xbf < bVar2,"is_repeated_ == label() == LABEL_REPEATED");
          }
          if (psVar10 != (string *)0x0) goto LAB_002c8cdf;
          if (((ulong)msg->msg_ & 0x2000) == 0) {
            MVar11 = Message::GetMetadata(local_158->msg_);
            local_128 = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                         )Reflection::MutableMessage
                                    (MVar11.reflection,local_158->msg_,(FieldDescriptor *)msg,
                                     (MessageFactory *)0x0);
          }
          else {
            MVar11 = Message::GetMetadata(local_158->msg_);
            local_128 = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                         )Reflection::AddMessage
                                    (MVar11.reflection,local_158->msg_,(FieldDescriptor *)msg,
                                     (MessageFactory *)0x0);
          }
          local_120 = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                       )0x1;
          local_118[0] = 0;
          local_100 = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                       )0x1;
          local_f8 = 0;
          local_140 = FieldDescriptor::message_type((FieldDescriptor *)msg);
          pFVar8 = Descriptor::map_key(local_140);
          switch(pFVar8->type_) {
          case '\x03':
          case '\x10':
          case '\x12':
            sVar12 = MaybeOwnedString::AsView((MaybeOwnedString *)&local_b8._M_first);
            cVar6 = absl::lts_20240722::numbers_internal::safe_strto64_base
                              (sVar12._M_len,sVar12._M_str,&local_178,10);
            if (cVar6 == '\0') {
              JsonLocation::Invalid
                        ((JsonLocation *)lex,&local_88,0x26,"non-number characters in quoted number"
                        );
            }
            else {
              ParseProto2Descriptor::SetInt64(pFVar8,(Msg *)&local_128.status_,(int64_t)local_178);
            }
            break;
          case '\x04':
          case '\x06':
            sVar12 = MaybeOwnedString::AsView((MaybeOwnedString *)&local_b8._M_first);
            cVar6 = absl::lts_20240722::numbers_internal::safe_strtou64_base
                              (sVar12._M_len,sVar12._M_str,&local_178,10);
            if (cVar6 == '\0') {
              JsonLocation::Invalid
                        ((JsonLocation *)lex,&local_88,0x26,"non-number characters in quoted number"
                        );
            }
            else {
              ParseProto2Descriptor::SetUInt64(pFVar8,(Msg *)&local_128.status_,(uint64_t)local_178)
              ;
            }
            break;
          case '\x05':
          case '\x0f':
          case '\x11':
            sVar12 = MaybeOwnedString::AsView((MaybeOwnedString *)&local_b8._M_first);
            cVar6 = absl::lts_20240722::numbers_internal::safe_strto32_base
                              (sVar12._M_len,sVar12._M_str,&local_178,10);
            if (cVar6 == '\0') {
              JsonLocation::Invalid
                        ((JsonLocation *)lex,&local_88,0x26,"non-number characters in quoted number"
                        );
            }
            else {
              ParseProto2Descriptor::SetInt32(pFVar8,(Msg *)&local_128.status_,(uint32_t)local_178);
            }
            break;
          case '\a':
          case '\r':
            sVar12 = MaybeOwnedString::AsView((MaybeOwnedString *)&local_b8._M_first);
            cVar6 = absl::lts_20240722::numbers_internal::safe_strtou32_base
                              (sVar12._M_len,sVar12._M_str,&local_178,10);
            if (cVar6 == '\0') {
              JsonLocation::Invalid
                        ((JsonLocation *)lex,&local_88,0x26,"non-number characters in quoted number"
                        );
            }
            else {
              ParseProto2Descriptor::SetUInt32(pFVar8,(Msg *)&local_128.status_,(uint32_t)local_178)
              ;
            }
            break;
          case '\b':
            bVar5 = json_internal::operator==
                              ((MaybeOwnedString *)&local_b8._M_first,(char (*) [5])0x352dca);
            if ((bVar5) ||
               (bVar7 = json_internal::operator==
                                  ((MaybeOwnedString *)&local_b8._M_first,(char (*) [6])"false"),
               bVar7)) {
              ParseProto2Descriptor::SetBool(pFVar8,(Msg *)&local_128.status_,bVar5);
              goto LAB_002c8b2a;
            }
            local_d0 = MaybeOwnedString::AsView((MaybeOwnedString *)&local_b8._M_first);
            local_138._M_str =
                 (char *)absl::lts_20240722::str_format_internal::FormatArgImpl::
                         Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
            local_138._M_len = (size_t)&local_d0;
            in_R8 = (char *)0x1;
            absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
                      (&local_178,"expected bool string, got \'%s\'",0x1e,&local_138);
            JsonLocation::Invalid((JsonLocation *)lex,&local_88,local_170,local_178);
            if (local_178 != &local_168) {
              operator_delete(local_178,local_168._M_len + 1);
            }
            goto LAB_002c8b47;
          case '\t':
            psVar9 = MaybeOwnedString::ToString_abi_cxx11_((MaybeOwnedString *)&local_b8._M_first);
            x._M_str = in_R8;
            x._M_len = (size_t)(psVar9->_M_dataplus)._M_p;
            ParseProto2Descriptor::SetString
                      ((ParseProto2Descriptor *)pFVar8,(Field)&local_128.status_,
                       (Msg *)psVar9->_M_string_length,x);
            goto LAB_002c8b2a;
          default:
            JsonLocation::Invalid((JsonLocation *)lex,local_150,0x18,"unsupported map key type");
            goto LAB_002c8b47;
          }
          if (cVar6 != '\0') {
LAB_002c8b2a:
            pFVar8 = Descriptor::map_value(local_140);
            ParseSingular<google::protobuf::json_internal::ParseProto2Descriptor>
                      (lex,field,
                       (Msg<google::protobuf::json_internal::ParseProto2Descriptor> *)pFVar8);
          }
LAB_002c8b47:
          absl::lts_20240722::container_internal::
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<int>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
          ::~raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<int>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                           *)&local_100.status_);
          absl::lts_20240722::container_internal::
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<int>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
          ::~raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<int>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                           *)&local_120.status_);
LAB_002c8b69:
          if ((lex->stream_).stream_ == (ZeroCopyInputStream *)0x1) {
            literal._M_str = ",";
            literal._M_len = 1;
            local_179 = JsonLexer::Peek((JsonLexer *)field,literal);
            bVar5 = true;
          }
          else {
LAB_002c8b8c:
            bVar5 = false;
          }
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                           *)&local_c0.status_);
          if (!bVar5) goto LAB_002c8cb0;
          literal_00._M_str = "}";
          literal_00._M_len = 1;
          bVar5 = JsonLexer::Peek((JsonLexer *)field,literal_00);
        } while (!bVar5);
        piVar1 = (int *)((long)&field->field_22 + 4);
        *piVar1 = *piVar1 + 1;
        if ((field[1].super_SymbolBase.symbol_type_ == '\0') && (local_179 != false)) {
          local_148 = "expected \'}\'";
LAB_002c8c99:
          JsonLocation::Invalid((JsonLocation *)lex,local_150,0xc,local_148);
          goto LAB_002c8cb0;
        }
      }
      (lex->stream_).stream_ = (ZeroCopyInputStream *)0x1;
    }
  }
LAB_002c8cb0:
  absl::lts_20240722::container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_68);
  return (Status)(uintptr_t)lex;
}

Assistant:

absl::Status ParseMap(JsonLexer& lex, Field<Traits> field, Msg<Traits>& msg) {
  if (lex.Peek(JsonLexer::kNull)) {
    return lex.Expect("null");
  }

  absl::flat_hash_set<std::string> keys_seen;
  return lex.VisitObject(
      [&](LocationWith<MaybeOwnedString>& key) -> absl::Status {
        lex.path().NextRepeated();
        auto insert_result = keys_seen.emplace(key.value.AsView());
        if (!insert_result.second) {
          return key.loc.Invalid(absl::StrFormat(
              "got unexpectedly-repeated repeated map key: '%s'",
              key.value.AsView()));
        }
        return Traits::NewMsg(
            field, msg,
            [&](const Desc<Traits>& type, Msg<Traits>& entry) -> absl::Status {
              auto key_field = Traits::KeyField(type);
              switch (Traits::FieldType(key_field)) {
                case FieldDescriptor::TYPE_INT64:
                case FieldDescriptor::TYPE_SINT64:
                case FieldDescriptor::TYPE_SFIXED64: {
                  int64_t n;
                  if (!absl::SimpleAtoi(key.value.AsView(), &n)) {
                    return key.loc.Invalid(
                        "non-number characters in quoted number");
                  }
                  Traits::SetInt64(key_field, entry, n);
                  break;
                }
                case FieldDescriptor::TYPE_UINT64:
                case FieldDescriptor::TYPE_FIXED64: {
                  uint64_t n;
                  if (!absl::SimpleAtoi(key.value.AsView(), &n)) {
                    return key.loc.Invalid(
                        "non-number characters in quoted number");
                  }
                  Traits::SetUInt64(key_field, entry, n);
                  break;
                }
                case FieldDescriptor::TYPE_INT32:
                case FieldDescriptor::TYPE_SINT32:
                case FieldDescriptor::TYPE_SFIXED32: {
                  int32_t n;
                  if (!absl::SimpleAtoi(key.value.AsView(), &n)) {
                    return key.loc.Invalid(
                        "non-number characters in quoted number");
                  }
                  Traits::SetInt32(key_field, entry, n);
                  break;
                }
                case FieldDescriptor::TYPE_UINT32:
                case FieldDescriptor::TYPE_FIXED32: {
                  uint32_t n;
                  if (!absl::SimpleAtoi(key.value.AsView(), &n)) {
                    return key.loc.Invalid(
                        "non-number characters in quoted number");
                  }
                  Traits::SetUInt32(key_field, entry, n);
                  break;
                }
                case FieldDescriptor::TYPE_BOOL: {
                  if (key.value == "true") {
                    Traits::SetBool(key_field, entry, true);
                  } else if (key.value == "false") {
                    Traits::SetBool(key_field, entry, false);
                  } else {
                    return key.loc.Invalid(absl::StrFormat(
                        "expected bool string, got '%s'", key.value.AsView()));
                  }
                  break;
                }
                case FieldDescriptor::TYPE_STRING: {
                  Traits::SetString(key_field, entry,
                                    std::move(key.value.ToString()));
                  break;
                }
                default:
                  return lex.Invalid("unsupported map key type");
              }

              return ParseSingular<Traits>(lex, Traits::ValueField(type),
                                           entry);
            });
      });
}